

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

SpectrumTextureHandle __thiscall
pbrt::TextureParameterDictionary::GetSpectrumTexture
          (TextureParameterDictionary *this,string *name,SpectrumHandle *defaultValue,
          SpectrumType spectrumType,Allocator alloc)

{
  bool bVar1;
  TaggedPointer *in_RCX;
  SpectrumHandle *in_RDI;
  polymorphic_allocator<std::byte> *in_R9;
  SpectrumTextureHandle tex;
  TextureParameterDictionary *in_stack_00000050;
  Allocator in_stack_00000058;
  TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
  args;
  TaggedPointer local_38 [56];
  
  args.bits = (uintptr_t)in_RDI;
  GetSpectrumTextureOrNull
            (in_stack_00000050,(string *)alloc.memoryResource,this._4_4_,in_stack_00000058);
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_38);
  if (bVar1) {
    SpectrumTextureHandle::SpectrumTextureHandle
              ((SpectrumTextureHandle *)in_RDI,(SpectrumTextureHandle *)in_RCX);
  }
  else {
    bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(in_RCX);
    if (bVar1) {
      pstd::pmr::polymorphic_allocator<std::byte>::
      new_object<pbrt::SpectrumConstantTexture,pbrt::SpectrumHandle&>
                (in_R9,(SpectrumHandle *)args.bits);
      SpectrumTextureHandle::TaggedPointer<pbrt::SpectrumConstantTexture>
                ((SpectrumTextureHandle *)in_RDI,(SpectrumConstantTexture *)in_RCX);
    }
    else {
      SpectrumTextureHandle::TaggedPointer((SpectrumTextureHandle *)in_RDI,in_RCX);
    }
  }
  return (SpectrumTextureHandle)
         (TaggedPointer<pbrt::RGBConstantTexture,_pbrt::RGBReflectanceConstantTexture,_pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
          )args.bits;
}

Assistant:

SpectrumTextureHandle TextureParameterDictionary::GetSpectrumTexture(
    const std::string &name, SpectrumHandle defaultValue, SpectrumType spectrumType,
    Allocator alloc) const {
    SpectrumTextureHandle tex = GetSpectrumTextureOrNull(name, spectrumType, alloc);
    if (tex)
        return tex;
    else if (defaultValue)
        return alloc.new_object<SpectrumConstantTexture>(defaultValue);
    else
        return nullptr;
}